

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cesl_mpsc_llfifo.c
# Opt level: O0

int cesl_mpsc_llfifo_push(cesl_mpsc_llfifo_t *self,char *elm_ptr,size_t elem_size)

{
  size_t sVar1;
  size_t sVar2;
  size_t index;
  char *__dest;
  size_t local_40;
  char *dst_ptr;
  size_t next_write_index;
  size_t elem_size_local;
  char *elm_ptr_local;
  cesl_mpsc_llfifo_t *self_local;
  
  local_40 = elem_size;
  if (elem_size == 0) {
    local_40 = self->elem_max_size_;
  }
  sVar1 = cesl_mpsc_llfifo_write_index(self);
  sVar1 = cesl_mpsc_llfifo_inc_index(self,sVar1);
  sVar2 = cesl_mpsc_llfifo_read_index(self);
  if (sVar1 != sVar2) {
    index = cesl_mpsc_llfifo_write_index(self);
    __dest = cesl_mpsc_llfifo_get_ptr_to_index(self,index);
    memcpy(__dest,elm_ptr,local_40);
    cesl_mpsc_llfifo_write_index_set(self,sVar1);
  }
  self_local._4_4_ = (uint)(sVar1 != sVar2);
  return self_local._4_4_;
}

Assistant:

int cesl_mpsc_llfifo_push (cesl_mpsc_llfifo_t* self, const char* elm_ptr, size_t elem_size )
{
    elem_size = elem_size == 0 ? self->elem_max_size_ : elem_size;

    size_t next_write_index = cesl_mpsc_llfifo_inc_index(self, cesl_mpsc_llfifo_write_index(self));
    if ( next_write_index != cesl_mpsc_llfifo_read_index(self) ) {
        char* dst_ptr = cesl_mpsc_llfifo_get_ptr_to_index(self, cesl_mpsc_llfifo_write_index(self));
        memcpy (dst_ptr, elm_ptr, elem_size);
        cesl_mpsc_llfifo_write_index_set(self, next_write_index);
        return 1;
    }
    return 0;
}